

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::removeVertex(Graph *this,int idx)

{
  pointer ppNVar1;
  pointer ppNVar2;
  Node *pNVar3;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> __dest;
  Node *pNVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Node **node;
  Node **ppNVar8;
  iterator __position;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  Node **ppNVar9;
  char local_39;
  Node *local_38;
  
  ppNVar1 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar2 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = getNode(this,idx);
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                     (ppNVar1,ppNVar2);
  ppNVar8 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar9 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar8 != ppNVar9) {
    do {
      pNVar3 = *ppNVar8;
      pNVar4 = getNode(this,idx);
      p_Var6 = (pNVar3->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      __position._M_node = &(pNVar3->edges)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var7 = __position._M_node;
      if (p_Var6 != (_Base_ptr)0x0) {
        do {
          if (*(Node **)(p_Var6 + 1) >= pNVar4) {
            p_Var7 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(Node **)(p_Var6 + 1) < pNVar4];
        } while (p_Var6 != (_Base_ptr)0x0);
        if ((p_Var7 != __position._M_node) && (*(Node **)(p_Var7 + 1) <= pNVar4)) {
          __position._M_node = p_Var7;
        }
      }
      if ((_Rb_tree_header *)__position._M_node !=
          &((*ppNVar8)->edges)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
        ::erase_abi_cxx11_((_Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                            *)&(*ppNVar8)->edges,__position);
      }
      ppNVar8 = ppNVar8 + 1;
    } while (ppNVar8 != ppNVar9);
    ppNVar9 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppNVar8 = __dest._M_current + 1;
  if (ppNVar8 != ppNVar9) {
    memmove(__dest._M_current,ppNVar8,(long)ppNVar9 - (long)ppNVar8);
    ppNVar9 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppNVar9 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Removed Vertex ",0xf);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,idx);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_39,1);
  return;
}

Assistant:

void Graph::removeVertex(int idx) {
    auto it = std::find(adj_list.begin(), adj_list.end(), getNode(idx));

    for(auto&node:adj_list){
        auto iter = node->edges.find(getNode(idx));
        if(iter!=node->edges.end())
            node->edges.erase(iter);
    }

    adj_list.erase(it);

    std::cerr<< "Removed Vertex " << idx<<'\n';
}